

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86.c
# Opt level: O1

size_t x86_code(void *simple_ptr,uint32_t now_pos,_Bool is_encoder,uint8_t *buffer,size_t size)

{
  uint uVar1;
  bool bVar2;
  size_t sVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  char cVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  
  if (size < 5) {
    sVar3 = 0;
  }
  else {
    uVar9 = *simple_ptr;
    iVar5 = now_pos - 5;
    if (now_pos - *(int *)((long)simple_ptr + 4) < 6) {
      iVar5 = *(int *)((long)simple_ptr + 4);
    }
    sVar3 = 0;
    do {
      if ((byte)(buffer[sVar3] + 0x16) < 0xfe) {
        sVar3 = sVar3 + 1;
      }
      else {
        iVar10 = (int)sVar3 + now_pos;
        uVar4 = iVar10 - iVar5;
        uVar7 = 0;
        if (uVar4 < 6) {
          if (iVar10 == iVar5) {
            uVar7 = (ulong)uVar9;
          }
          else {
            iVar5 = uVar4 + (uVar4 == 0);
            uVar7 = (ulong)uVar9;
            do {
              uVar7 = (ulong)(((uint)uVar7 & 0x77) * 2);
              iVar5 = iVar5 + -1;
            } while (iVar5 != 0);
          }
        }
        uVar9 = 1;
        uVar4 = (uint)uVar7;
        iVar5 = iVar10;
        if ((byte)(buffer[sVar3 + 4] + 1) < 2) {
          uVar9 = 0x11;
          if ((x86_code::MASK_TO_ALLOWED_STATUS[(uint)(uVar7 >> 1) & 7] == true) && (uVar4 < 0x20))
          {
            uVar9 = (uint)buffer[sVar3 + 1] |
                    (uint)buffer[sVar3 + 2] << 8 |
                    (uint)buffer[sVar3 + 3] << 0x10 | (uint)buffer[sVar3 + 4] << 0x18;
            iVar11 = -5 - iVar10;
            if (is_encoder) {
              iVar11 = iVar10 + 5;
            }
            do {
              uVar1 = uVar9 + iVar11;
              if (uVar4 == 0) break;
              cVar8 = (char)(x86_code::MASK_TO_BIT_NUMBER[uVar7 >> 1] << 3);
              uVar6 = uVar1 >> (0x18U - cVar8 & 0x1f);
              if (((char)uVar6 == -1) || ((uVar6 & 0xff) == 0)) {
                uVar9 = ~((uint)(-1L << (-(cVar8 + ' ') & 0x3fU)) ^ uVar1);
                bVar2 = true;
              }
              else {
                bVar2 = false;
              }
            } while (bVar2);
            buffer[sVar3 + 4] = (uint8_t)((int)(uVar1 * 0x80) >> 0x1f);
            buffer[sVar3 + 3] = (uint8_t)(uVar1 >> 0x10);
            buffer[sVar3 + 2] = (uint8_t)(uVar1 >> 8);
            buffer[sVar3 + 1] = (uint8_t)uVar1;
            sVar3 = sVar3 + 5;
            uVar9 = 0;
            goto LAB_004ad5ae;
          }
        }
        sVar3 = sVar3 + 1;
        uVar9 = uVar9 | uVar4;
      }
LAB_004ad5ae:
    } while (sVar3 <= size - 5);
    *(uint *)simple_ptr = uVar9;
    *(int *)((long)simple_ptr + 4) = iVar5;
  }
  return sVar3;
}

Assistant:

static size_t
x86_code(void *simple_ptr, uint32_t now_pos, bool is_encoder,
		uint8_t *buffer, size_t size)
{
	static const bool MASK_TO_ALLOWED_STATUS[8]
		= { true, true, true, false, true, false, false, false };

	static const uint32_t MASK_TO_BIT_NUMBER[8]
			= { 0, 1, 2, 2, 3, 3, 3, 3 };

	lzma_simple_x86 *simple = simple_ptr;
	uint32_t prev_mask = simple->prev_mask;
	uint32_t prev_pos = simple->prev_pos;

	if (size < 5)
		return 0;

	if (now_pos - prev_pos > 5)
		prev_pos = now_pos - 5;

	const size_t limit = size - 5;
	size_t buffer_pos = 0;

	while (buffer_pos <= limit) {
		uint8_t b = buffer[buffer_pos];
		if (b != 0xE8 && b != 0xE9) {
			++buffer_pos;
			continue;
		}

		const uint32_t offset = now_pos + (uint32_t)(buffer_pos)
				- prev_pos;
		prev_pos = now_pos + (uint32_t)(buffer_pos);

		if (offset > 5) {
			prev_mask = 0;
		} else {
			for (uint32_t i = 0; i < offset; ++i) {
				prev_mask &= 0x77;
				prev_mask <<= 1;
			}
		}

		b = buffer[buffer_pos + 4];

		if (Test86MSByte(b)
			&& MASK_TO_ALLOWED_STATUS[(prev_mask >> 1) & 0x7]
				&& (prev_mask >> 1) < 0x10) {

			uint32_t src = ((uint32_t)(b) << 24)
				| ((uint32_t)(buffer[buffer_pos + 3]) << 16)
				| ((uint32_t)(buffer[buffer_pos + 2]) << 8)
				| (buffer[buffer_pos + 1]);

			uint32_t dest;
			while (true) {
				if (is_encoder)
					dest = src + (now_pos + (uint32_t)(
							buffer_pos) + 5);
				else
					dest = src - (now_pos + (uint32_t)(
							buffer_pos) + 5);

				if (prev_mask == 0)
					break;

				const uint32_t i = MASK_TO_BIT_NUMBER[
						prev_mask >> 1];

				b = (uint8_t)(dest >> (24 - i * 8));

				if (!Test86MSByte(b))
					break;

				src = dest ^ ((1ull << (32 - i * 8)) - 1);
			}

			buffer[buffer_pos + 4]
					= (uint8_t)(~(((dest >> 24) & 1) - 1));
			buffer[buffer_pos + 3] = (uint8_t)(dest >> 16);
			buffer[buffer_pos + 2] = (uint8_t)(dest >> 8);
			buffer[buffer_pos + 1] = (uint8_t)(dest);
			buffer_pos += 5;
			prev_mask = 0;

		} else {
			++buffer_pos;
			prev_mask |= 1;
			if (Test86MSByte(b))
				prev_mask |= 0x10;
		}
	}

	simple->prev_mask = prev_mask;
	simple->prev_pos = prev_pos;

	return buffer_pos;
}